

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O3

void Assimp::IFC::ExtractVerticesFromClipper
               (Polygon *poly,
               vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *temp_contour,
               bool filter_duplicates)

{
  pointer *ppaVar1;
  pointer paVar2;
  pointer pIVar3;
  iterator __position;
  IfcVector2 *cp;
  aiVector2t<double> *paVar4;
  IntPoint *point;
  pointer pIVar5;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *__range2;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  aiVector2t<double> local_38;
  
  paVar2 = (temp_contour->
           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((temp_contour->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != paVar2) {
    (temp_contour->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
    _M_impl.super__Vector_impl_data._M_finish = paVar2;
  }
  pIVar5 = (poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pIVar3 = (poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pIVar5 == pIVar3) {
      return;
    }
    auVar7._0_8_ = (double)pIVar5->X;
    auVar7._8_8_ = (double)pIVar5->Y;
    auVar8._8_8_ = 0x41d6a09e66400000;
    auVar8._0_8_ = 0x41d6a09e66400000;
    auVar8 = divpd(auVar7,auVar8);
    auVar8 = maxpd(ZEXT816(0),auVar8);
    auVar6._8_8_ = 0x3ff0000000000000;
    auVar6._0_8_ = 0x3ff0000000000000;
    local_38 = (aiVector2t<double>)minpd(auVar6,auVar8);
    paVar4 = (temp_contour->
             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __position._M_current =
         (temp_contour->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (paVar4 != __position._M_current && filter_duplicates) {
      do {
        dVar9 = paVar4->x - local_38.x;
        dVar10 = paVar4->y - local_38.y;
        if (dVar9 * dVar9 + dVar10 * dVar10 < 9.999999747378752e-06) goto LAB_005aeaf2;
        paVar4 = paVar4 + 1;
      } while (paVar4 != __position._M_current);
    }
    if (__position._M_current ==
        (temp_contour->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
      _M_realloc_insert<aiVector2t<double>const&>
                ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)temp_contour,
                 __position,&local_38);
    }
    else {
      (__position._M_current)->x = local_38.x;
      (__position._M_current)->y = local_38.y;
      ppaVar1 = &(temp_contour->
                 super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
LAB_005aeaf2:
    pIVar5 = pIVar5 + 1;
  } while( true );
}

Assistant:

void ExtractVerticesFromClipper(const ClipperLib::Polygon& poly, std::vector<IfcVector2>& temp_contour,
    bool filter_duplicates = false)
{
    temp_contour.clear();
    for(const ClipperLib::IntPoint& point : poly) {
        IfcVector2 vv = IfcVector2( from_int64(point.X), from_int64(point.Y));
        vv = std::max(vv,IfcVector2());
        vv = std::min(vv,one_vec);

        if (!filter_duplicates || !IsDuplicateVertex(vv, temp_contour)) {
            temp_contour.push_back(vv);
        }
    }
}